

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_modes_sb(AV1_COMP *cpi,ThreadData *td,TileInfo *tile,aom_writer *w,TokenExtra **tok,
                   TokenExtra *tok_end,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  TileInfo *in_RCX;
  ThreadData *in_RDX;
  AV1_COMP *in_RSI;
  int *in_RDI;
  AV1Common *in_R8;
  TokenExtra **in_R9;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  int in_stack_00000008;
  BLOCK_SIZE BStack0000000000000010;
  BLOCK_SIZE in_stack_00000018;
  undefined7 in_stack_00000019;
  int this_mi_col;
  int this_mi_row;
  int runit_idx;
  int rcol;
  int rrow;
  int rstride;
  int rrow1;
  int rrow0;
  int rcol1;
  int rcol0;
  int plane;
  int num_planes;
  BLOCK_SIZE subsize;
  int in_stack_00000050;
  PARTITION_TYPE partition;
  int i;
  int quarter_step;
  int hbs;
  MACROBLOCKD *xd;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  undefined8 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int plane_00;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int iVar8;
  undefined2 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  aom_writer *w_00;
  int *rcol0_00;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0xefe0);
  rcol0_00 = in_RDI + 0xf062;
  w_00 = (aom_writer *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19);
  uVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_stack_00000018] / 2;
  uVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_stack_00000018] / 4;
  bVar1 = get_partition(cm_00,in_stack_00000008,_BStack0000000000000010,in_stack_00000018);
  BVar2 = get_partition_subsize
                    ((BLOCK_SIZE)((ulong)in_stack_ffffffffffffff60 >> 0x30),
                     (PARTITION_TYPE)((ulong)in_stack_ffffffffffffff60 >> 0x28));
  if ((in_stack_00000008 < rcol0_00[3]) && (_BStack0000000000000010 < rcol0_00[4])) {
    iVar5 = av1_num_planes(cm_00);
    for (iVar8 = 0; iVar8 < iVar5; iVar8 = iVar8 + 1) {
      plane_00 = in_stack_ffffffffffffff94;
      if ((cm_00->rst_info[iVar8].frame_restoration_type != RESTORE_NONE) &&
         (iVar6 = av1_loop_restoration_corners_in_sb
                            (in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                             (int)((ulong)cm_00 >> 0x20),(BLOCK_SIZE)((ulong)cm_00 >> 0x18),rcol0_00
                             ,(int *)in_RSI,in_RDI,(int *)CONCAT44(unaff_retaddr_00,unaff_retaddr)),
         plane_00 = in_stack_ffffffffffffff94, iVar6 != 0)) {
        in_stack_ffffffffffffff8c = cm_00->rst_info[iVar8].horz_units;
        for (; in_stack_ffffffffffffff88 = in_stack_ffffffffffffff94,
            iVar6 = in_stack_ffffffffffffff9c, in_stack_ffffffffffffff94 < in_stack_ffffffffffffff90
            ; in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
          for (; in_stack_ffffffffffffff9c < in_stack_ffffffffffffff98;
              in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
            in_stack_ffffffffffffff80 =
                 in_stack_ffffffffffffff9c + in_stack_ffffffffffffff94 * in_stack_ffffffffffffff8c;
            loop_restoration_write_sb_coeffs
                      ((AV1_COMMON *)CONCAT44(uVar3,uVar4),
                       (MACROBLOCKD *)
                       CONCAT44(in_stack_ffffffffffffffac,
                                CONCAT13(bVar1,CONCAT12(BVar2,in_stack_ffffffffffffffa8))),iVar5,
                       (aom_writer *)CONCAT44(iVar6,in_stack_ffffffffffffff98),plane_00,
                       (FRAME_COUNTS *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff94)
                      );
          }
          in_stack_ffffffffffffff84 = in_stack_ffffffffffffff9c;
          in_stack_ffffffffffffff9c = iVar6;
        }
      }
      in_stack_ffffffffffffff94 = plane_00;
    }
    write_partition((AV1_COMMON *)CONCAT44(iVar5,iVar8),
                    (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                    (PARTITION_TYPE)((uint)in_stack_ffffffffffffff88 >> 0x18),(BLOCK_SIZE)uVar4,w_00
                   );
    uVar7 = (ulong)bVar1;
    switch(uVar7) {
    case 0:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      break;
    case 1:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      if ((int)(in_stack_00000008 + uVar3) < rcol0_00[3]) {
        write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                      (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                      quarter_step);
      }
      break;
    case 2:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      if ((int)(_BStack0000000000000010 + uVar3) < rcol0_00[4]) {
        write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                      (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                      quarter_step);
      }
      break;
    case 3:
      write_modes_sb(in_RSI,in_RDX,in_RCX,(aom_writer *)in_R8,in_R9,(TokenExtra *)cm_00,
                     unaff_retaddr,in_stack_00000008,BStack0000000000000010);
      write_modes_sb(in_RSI,in_RDX,in_RCX,(aom_writer *)in_R8,in_R9,(TokenExtra *)cm_00,
                     unaff_retaddr,in_stack_00000008,BStack0000000000000010);
      write_modes_sb(in_RSI,in_RDX,in_RCX,(aom_writer *)in_R8,in_R9,(TokenExtra *)cm_00,
                     unaff_retaddr,in_stack_00000008,BStack0000000000000010);
      write_modes_sb(in_RSI,in_RDX,in_RCX,(aom_writer *)in_R8,in_R9,(TokenExtra *)cm_00,
                     unaff_retaddr,in_stack_00000008,BStack0000000000000010);
      break;
    case 4:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      break;
    case 5:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      break;
    case 6:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      break;
    case 7:
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                    (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                    quarter_step);
      break;
    case 8:
      for (iVar5 = 0;
          (iVar5 < 4 &&
          ((in_stack_ffffffffffffff7c = in_stack_00000008 + iVar5 * uVar4, iVar5 < 1 ||
           (in_stack_ffffffffffffff7c < rcol0_00[3])))); iVar5 = iVar5 + 1) {
        write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                      (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                      quarter_step);
      }
      break;
    case 9:
      for (iVar5 = 0;
          (iVar5 < 4 &&
          ((in_stack_ffffffffffffff78 = _BStack0000000000000010 + iVar5 * uVar4, iVar5 < 1 ||
           (in_stack_ffffffffffffff78 < rcol0_00[4])))); iVar5 = iVar5 + 1) {
        write_modes_b(_rcol1,_rrow1,_rrow,_runit_idx,_this_mi_col,
                      (TokenExtra *)CONCAT71(in_stack_00000019,in_stack_00000018),in_stack_00000050,
                      quarter_step);
      }
    }
    update_ext_partition_context
              ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,(BLOCK_SIZE)(uVar7 >> 0x38),
               (BLOCK_SIZE)(uVar7 >> 0x30),(PARTITION_TYPE)(uVar7 >> 0x28));
  }
  return;
}

Assistant:

static inline void write_modes_sb(AV1_COMP *const cpi, ThreadData *const td,
                                  const TileInfo *const tile,
                                  aom_writer *const w, const TokenExtra **tok,
                                  const TokenExtra *const tok_end, int mi_row,
                                  int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

#if !CONFIG_REALTIME_ONLY
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    int rcol0, rcol1, rrow0, rrow1;

    // Skip some unnecessary work if loop restoration is disabled
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

    if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                           &rcol0, &rcol1, &rrow0, &rrow1)) {
      const int rstride = cm->rst_info[plane].horz_units;
      for (int rrow = rrow0; rrow < rrow1; ++rrow) {
        for (int rcol = rcol0; rcol < rcol1; ++rcol) {
          const int runit_idx = rcol + rrow * rstride;
          loop_restoration_write_sb_coeffs(cm, xd, runit_idx, w, plane,
                                           td->counts);
        }
      }
    }
  }
#endif

  write_partition(cm, xd, hbs, mi_row, mi_col, partition, bsize, w);
  switch (partition) {
    case PARTITION_NONE:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_row + hbs < mi_params->mi_rows)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_col + hbs < mi_params->mi_cols)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col, subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs,
                     subsize);
      break;
    case PARTITION_HORZ_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }

  // update partition context
  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}